

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int uv__sem_trywait(uv_sem_t *sem)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int r;
  uv_sem_t *sem_local;
  
  do {
    iVar1 = sem_trywait((sem_t *)sem);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (iVar1 == 0) {
    sem_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 != 0xb) {
      abort();
    }
    sem_local._4_4_ = -0xb;
  }
  return sem_local._4_4_;
}

Assistant:

static int uv__sem_trywait(uv_sem_t* sem) {
  int r;

  do
    r = sem_trywait(sem);
  while (r == -1 && errno == EINTR);

  if (r) {
    if (errno == EAGAIN)
      return UV_EAGAIN;
    abort();
  }

  return 0;
}